

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_sinks-inl.h
# Opt level: O0

shared_ptr<spdlog::logger>
spdlog::stdout_logger_mt<spdlog::synchronous_factory>(string *logger_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  shared_ptr<spdlog::logger> sVar1;
  string *in_stack_00000008;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  synchronous_factory::create<spdlog::sinks::stdout_sink<spdlog::details::console_mutex>>
            (in_stack_00000008);
  std::__cxx11::string::~string(local_30);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> stdout_logger_mt(const std::string &logger_name) {
    return Factory::template create<sinks::stdout_sink_mt>(logger_name);
}